

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

string * __thiscall
Corrade::Utility::String::Implementation::stripPrefix
          (string *__return_storage_ptr__,Implementation *this,string *string,
          ArrayView<const_char> prefix)

{
  Implementation *pIVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *output;
  ArrayView<const_char> prefix_00;
  Error local_40;
  
  prefix_00._size = prefix._data;
  prefix_00._data = (char *)string;
  bVar3 = beginsWith(*(ArrayView<const_char> *)this,prefix_00);
  if (bVar3) {
    std::__cxx11::string::erase((ulong)this,0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pIVar1 = this + 0x10;
    if (*(Implementation **)this == pIVar1) {
      uVar2 = *(undefined8 *)(this + 0x18);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)pIVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*(Implementation **)this;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)pIVar1;
    }
    __return_storage_ptr__->_M_string_length = *(size_type *)(this + 8);
    *(Implementation **)this = pIVar1;
    *(undefined8 *)(this + 8) = 0;
    this[0x10] = (Implementation)0x0;
    return __return_storage_ptr__;
  }
  output = Error::defaultOutput();
  Error::Error(&local_40,output,(Flags)0x0);
  Debug::operator<<(&local_40.super_Debug,
                    "Utility::String::stripPrefix(): string doesn\'t begin with given prefix");
  Error::~Error(&local_40);
  abort();
}

Assistant:

std::string stripPrefix(std::string string, const Containers::ArrayView<const char> prefix) {
    CORRADE_ASSERT(beginsWith({string.data(), string.size()}, prefix),
        "Utility::String::stripPrefix(): string doesn't begin with given prefix", {});
    string.erase(0, prefix.size());
    return string;
}